

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  _List_node_base *p_Var1;
  Scene *pSVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  double dVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  Vector3D local_78;
  double local_58;
  double dStack_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  pSVar2 = (this->super_SceneObject).scene;
  if (pSVar2 != (Scene *)0x0) {
    if ((Halfedge *)(pSVar2->selected).element == h) {
      lVar10 = 0x1e0;
      goto LAB_0016dc0b;
    }
    if ((Halfedge *)(pSVar2->hovered).element == h) {
      lVar10 = 0x1d8;
      goto LAB_0016dc0b;
    }
  }
  lVar10 = 0x1d0;
LAB_0016dc0b:
  lVar10 = *(long *)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar10);
  glColor4fv(lVar10);
  glLineWidth(*(undefined4 *)(lVar10 + 0x50));
  p_Var3 = (h->_next)._M_node;
  p_Var4 = (h->_vertex)._M_node;
  p_Var5 = p_Var3[2]._M_prev;
  p_Var6 = p_Var3[2]._M_next[2]._M_prev;
  p_Var3 = p_Var5[2]._M_prev;
  p_Var1 = p_Var4[2]._M_prev;
  dVar12 = (((double)p_Var3 - (double)p_Var1) - ((double)p_Var1 - (double)p_Var6[2]._M_prev)) * 0.5
           * 0.2 + (double)p_Var1;
  p_Var8 = p_Var5[1]._M_prev;
  p_Var5 = p_Var5[2]._M_next;
  p_Var9 = p_Var4[1]._M_prev;
  p_Var4 = p_Var4[2]._M_next;
  dVar18 = (((double)p_Var8 - (double)p_Var9) - ((double)p_Var9 - (double)p_Var6[1]._M_prev)) * 0.5
           * 0.2 + (double)p_Var9;
  dStack_30 = (((double)p_Var5 - (double)p_Var4) - ((double)p_Var4 - (double)p_Var6[2]._M_next)) *
              0.5 * 0.2 + (double)p_Var4;
  dVar15 = (((double)p_Var6[2]._M_prev - (double)p_Var3) - ((double)p_Var3 - (double)p_Var1)) * 0.5
           * 0.2 + (double)p_Var3;
  dVar16 = (((double)p_Var6[1]._M_prev - (double)p_Var8) - ((double)p_Var8 - (double)p_Var9)) * 0.5
           * 0.2 + (double)p_Var8;
  dVar17 = (((double)p_Var6[2]._M_next - (double)p_Var5) - ((double)p_Var5 - (double)p_Var4)) * 0.5
           * 0.2 + (double)p_Var5;
  dVar7 = (dVar17 - dStack_30) * 0.2;
  local_58 = dVar16;
  dStack_50 = dVar17;
  local_48 = dVar15;
  local_38 = dVar18;
  local_28 = dVar12;
  Face::normal(&local_78,(Face *)((h->_face)._M_node + 1));
  dVar11 = (dVar15 - dVar12) * 0.2;
  dVar18 = (dVar16 - dVar18) * 0.2;
  dVar13 = dVar18 * local_78.y;
  dVar14 = dVar11 * local_78.x;
  dVar12 = local_78.x * dVar7;
  local_78.x = (local_78.y * dVar11 - dVar7 * local_78.z) * 0.49999999999999994 +
               dVar18 * -0.8660254037844387 + dVar16;
  local_78.y = (local_78.z * dVar18 - dVar14) * 0.49999999999999994 +
               dVar7 * -0.8660254037844387 + dVar17;
  local_78.z = (dVar12 - dVar13) * 0.49999999999999994 + (dVar15 - dVar11 * 0.8660254037844387);
  glBegin(3);
  glVertex3dv(&local_38);
  glVertex3dv(&local_58);
  glVertex3dv(&local_78);
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}